

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O3

kStatus __thiscall
gnilk::Log::Warning<char_const*,char_const*>(Log *this,char *arguments,char *arguments_1)

{
  int iVar1;
  size_t sVar2;
  kStatus kVar3;
  basic_string_view<char> format;
  basic_format_args<fmt::v10::basic_printf_context<char>_> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string local_268;
  char *local_248 [2];
  buffer<char> local_238;
  char local_218 [504];
  
  kVar3 = kFiltered;
  if ((this->isEnabled == true) && ((int)this->logLevelThreshold < 0x12d)) {
    sVar2 = strlen(arguments);
    local_238.size_ = 0;
    local_238._vptr_buffer = (_func_int **)&PTR_grow_0021e498;
    local_238.capacity_ = 500;
    format.size_ = sVar2;
    format.data_ = arguments;
    args.field_1.values_ = (value<fmt::v10::basic_printf_context<char>_> *)local_248;
    args.desc_ = 0xc;
    local_248[0] = arguments_1;
    local_238.ptr_ = local_218;
    ::fmt::v10::detail::vprintf<char,fmt::v10::basic_printf_context<char>>(&local_238,format,args);
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,local_238.ptr_,local_238.ptr_ + local_238.size_);
    if (local_238.ptr_ != local_218) {
      operator_delete(local_238.ptr_,local_238.capacity_);
    }
    iVar1 = SendLogMessage(this,kWarning,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    kVar3 = (uint)(iVar1 < 1) * 2;
  }
  return kVar3;
}

Assistant:

inline kStatus Warning(T... arguments) const {
            if (!(isEnabled && WithinRange(kWarning))) return kStatus::kFiltered;
            auto str = fmt::sprintf(arguments...);
            return (SendLogMessage(kWarning, str) > 0) ? kStatus::kOk : kStatus::kSendError;
        }